

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

double __thiscall choc::value::ValueView::getFloat64(ValueView *this)

{
  if ((this->type).mainType == float64) {
    return *(double *)this->data;
  }
  throwError("Value is not a float64");
}

Assistant:

bool isType (Types... types) const noexcept   { return ((mainType == types) || ...); }